

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O0

double * append_coord_dofs_face
                   (int order,double *dest,double *verts,int *edges,int *faces,int nfaces,
                   double travel,int component)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long in_RCX;
  long in_RDX;
  double *in_RSI;
  int in_EDI;
  long in_R8;
  int in_R9D;
  double in_XMM0_Qa;
  double dVar9;
  double dVar10;
  double dVar11;
  double *ptr;
  double s;
  double r;
  double value;
  int v3;
  int v2;
  int v1;
  int v0;
  int e2;
  int e0;
  int jj;
  int ii;
  int i;
  double *local_80;
  int local_44;
  int local_40;
  int local_3c;
  
  local_80 = in_RSI;
  if (1 < in_EDI) {
    for (local_3c = 0; local_3c < in_R9D; local_3c = local_3c + 1) {
      iVar5 = *(int *)(in_R8 + (long)(local_3c << 2) * 4);
      iVar6 = *(int *)(in_R8 + (long)(local_3c * 4 + 2) * 4);
      iVar7 = *(int *)(in_RCX + (long)(iVar5 * 2 + 1) * 4);
      iVar5 = *(int *)(in_RCX + (long)(iVar5 << 1) * 4);
      iVar8 = *(int *)(in_RCX + (long)(iVar6 << 1) * 4);
      iVar6 = *(int *)(in_RCX + (long)(iVar6 * 2 + 1) * 4);
      for (local_44 = 1; local_44 < in_EDI; local_44 = local_44 + 1) {
        for (local_40 = 1; local_40 < in_EDI; local_40 = local_40 + 1) {
          dVar9 = (double)local_40 / (double)in_EDI;
          dVar10 = (double)local_44 / (double)in_EDI;
          dVar1 = *(double *)(in_RDX + (long)(iVar7 * 3 + (int)ptr) * 8);
          dVar2 = *(double *)(in_RDX + (long)(iVar5 * 3 + (int)ptr) * 8);
          dVar3 = *(double *)(in_RDX + (long)(iVar8 * 3 + (int)ptr) * 8);
          dVar4 = *(double *)(in_RDX + (long)(iVar6 * 3 + (int)ptr) * 8);
          dVar11 = drand48();
          dVar11 = cos(dVar11 * 2.0 * 3.141592653589793);
          *local_80 = in_XMM0_Qa * dVar11 +
                      (1.0 - dVar9) * dVar10 * dVar4 +
                      dVar9 * dVar10 * dVar3 +
                      (1.0 - dVar9) * (1.0 - dVar10) * dVar1 + dVar9 * (1.0 - dVar10) * dVar2;
          local_80 = local_80 + 1;
        }
      }
    }
  }
  return local_80;
}

Assistant:

double *
append_coord_dofs_face(int order, double *dest, const double *verts,
                       const int *edges, const int *faces, int nfaces, double travel,
                       int component) {
  int i,ii,jj,e0,e2,v0,v1,v2,v3;
  double value, r,s, *ptr = dest;
  if(order >= 2) {
    for(i = 0; i < nfaces; ++i) {
      /* NOTE: we assume edges point the same way. */
      e0 = faces[i*4+0];
      e2 = faces[i*4+2];

      /* 3012 seems to be the ordering to get interior dofs
         in the right order. */
      v0 = edges[e0*2+1];
      v1 = edges[e0*2+0];
      v2 = edges[e2*2+0];
      v3 = edges[e2*2+1];

      /* Make interior points by blending the quad vertices */
      for(jj = 1; jj < order; ++jj)
        for(ii = 1; ii < order; ++ii) {
          r = ((double)ii)/((double)order);
          s = ((double)jj)/((double)order);

          value = (1.-r)*(1.-s)*verts[v0*3+component] +
                  r     *(1.-s)*verts[v1*3+component] +
                  r     *s     *verts[v2*3+component] +
                  (1.-r)*s     *verts[v3*3+component];

          /* Perturb the point */
          value += travel * cos(drand48() * 2 * M_PI);

          *ptr++ = value;
        }
    }
  }
  return ptr;
}